

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewCNF.hpp
# Opt level: O0

void __thiscall Shell::NewCNF::~NewCNF(NewCNF *this)

{
  DHMap<Kernel::Formula_*,_Shell::NewCNF::Occurrences,_Lib::DefaultHash,_Lib::DefaultHash2> *in_RDI;
  BindingStore *in_stack_00000020;
  
  Lib::
  DHMap<Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Kernel::Substitution_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::~DHMap((DHMap<Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Kernel::Substitution_*,_Lib::DefaultHash,_Lib::DefaultHash2>
            *)in_RDI);
  Lib::
  DHMap<const_Lib::SharedSet<unsigned_int>_*,_Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::~DHMap((DHMap<const_Lib::SharedSet<unsigned_int>_*,_Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
            *)in_RDI);
  Lib::
  DHMap<Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::~DHMap((DHMap<Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
            *)in_RDI);
  Lib::
  DHMap<const_Lib::SharedSet<unsigned_int>_*,_Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::~DHMap((DHMap<const_Lib::SharedSet<unsigned_int>_*,_Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
            *)in_RDI);
  Lib::
  DHMap<Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::~DHMap((DHMap<Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::List<std::pair<unsigned_int,_Kernel::Term_*>_>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
            *)in_RDI);
  Lib::
  DHMap<Kernel::Formula_*,_const_Lib::SharedSet<unsigned_int>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::~DHMap((DHMap<Kernel::Formula_*,_const_Lib::SharedSet<unsigned_int>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
            *)in_RDI);
  Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)in_RDI);
  Lib::DHMap<Kernel::Formula_*,_Shell::NewCNF::Occurrences,_Lib::DefaultHash,_Lib::DefaultHash2>::
  ~DHMap(in_RDI);
  std::__cxx11::
  list<Lib::SmartPtr<Shell::NewCNF::GenClause>,_std::allocator<Lib::SmartPtr<Shell::NewCNF::GenClause>_>_>
  ::~list((list<Lib::SmartPtr<Shell::NewCNF::GenClause>,_std::allocator<Lib::SmartPtr<Shell::NewCNF::GenClause>_>_>
           *)0x7de677);
  Lib::DHMap<Kernel::Formula_*,_bool,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            ((DHMap<Kernel::Formula_*,_bool,_Lib::DefaultHash,_Lib::DefaultHash2> *)in_RDI);
  Lib::DHMap<Kernel::Literal_*,_bool,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            ((DHMap<Kernel::Literal_*,_bool,_Lib::DefaultHash,_Lib::DefaultHash2> *)in_RDI);
  BindingStore::~BindingStore(in_stack_00000020);
  BindingStore::~BindingStore(in_stack_00000020);
  Lib::Deque<Kernel::Formula_*>::~Deque((Deque<Kernel::Formula_*> *)in_RDI);
  return;
}

Assistant:

NewCNF(unsigned namingThreshold)
    : _namingThreshold(namingThreshold), _iteInliningThreshold((unsigned)ceil(log2(namingThreshold))),
      _collectedVarSorts(false), _maxVar(0),_forInduction(false) {}